

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source)

{
  float fVar1;
  int64_t iVar2;
  int64_t iVar3;
  float *pfVar4;
  AlignedVector<float> *in_RSI;
  AlignedVector<float> *in_RDI;
  int64_t i;
  size_t local_18;
  
  iVar2 = size((Vector *)0x15c3ed);
  iVar3 = size((Vector *)0x15c3fc);
  if (iVar2 == iVar3) {
    local_18 = 0;
    while( true ) {
      iVar2 = size((Vector *)0x15c447);
      if (iVar2 <= (long)local_18) break;
      pfVar4 = intgemm::AlignedVector<float>::operator[](in_RSI,local_18);
      fVar1 = *pfVar4;
      pfVar4 = intgemm::AlignedVector<float>::operator[](in_RDI,local_18);
      *pfVar4 = fVar1 + *pfVar4;
      local_18 = local_18 + 1;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/vector.cc"
                ,0x29,"void fasttext::Vector::addVector(const Vector &)");
}

Assistant:

void Vector::addVector(const Vector& source) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += source.data_[i];
  }
}